

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

float * __thiscall ImGuiStorage::GetFloatRef(ImGuiStorage *this,ImGuiID key,float default_val)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImGuiStoragePair *pIVar4;
  ulong uVar5;
  ImGuiStoragePair *pIVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  
  pIVar4 = (this->Data).Data;
  iVar2 = (this->Data).Size;
  pIVar6 = pIVar4;
  uVar8 = (long)iVar2;
  while (uVar5 = uVar8, uVar5 != 0) {
    uVar8 = uVar5 >> 1;
    if (pIVar6[uVar8].key < key) {
      pIVar6 = pIVar6 + uVar8 + 1;
      uVar8 = ~uVar8 + uVar5;
    }
  }
  if ((pIVar6 == pIVar4 + iVar2) || (pIVar6->key != key)) {
    lVar11 = (long)pIVar6 - (long)pIVar4;
    iVar3 = (this->Data).Capacity;
    if (iVar2 == iVar3) {
      if (iVar3 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar3 / 2 + iVar3;
      }
      iVar12 = iVar2 + 1;
      if (iVar2 + 1 < iVar7) {
        iVar12 = iVar7;
      }
      if (iVar3 < iVar12) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar6 = (ImGuiStoragePair *)
                 (*GImAllocatorAllocFunc)((long)iVar12 << 4,GImAllocatorUserData);
        pIVar4 = (this->Data).Data;
        if (pIVar4 != (ImGuiStoragePair *)0x0) {
          memcpy(pIVar6,pIVar4,(long)(this->Data).Size << 4);
          pIVar4 = (this->Data).Data;
          if ((pIVar4 != (ImGuiStoragePair *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        }
        (this->Data).Data = pIVar6;
        (this->Data).Capacity = iVar12;
      }
    }
    lVar9 = (long)(this->Data).Size;
    lVar10 = lVar9 - (lVar11 >> 4);
    if (lVar10 != 0 && lVar11 >> 4 <= lVar9) {
      pIVar4 = (this->Data).Data;
      memmove((void *)((long)pIVar4 + lVar11 + 0x10),(void *)((long)pIVar4 + lVar11),lVar10 * 0x10);
    }
    pIVar4 = (this->Data).Data;
    *(ImGuiID *)((long)pIVar4 + lVar11) = key;
    *(float *)((long)pIVar4 + lVar11 + 8) = default_val;
    (this->Data).Size = (this->Data).Size + 1;
    pIVar6 = (ImGuiStoragePair *)(lVar11 + (long)(this->Data).Data);
  }
  return (float *)&pIVar6->field_1;
}

Assistant:

float* ImGuiStorage::GetFloatRef(ImGuiID key, float default_val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, ImGuiStoragePair(key, default_val));
    return &it->val_f;
}